

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_error_mixed.c
# Opt level: O1

void test_error_mixed(void)

{
  wchar_t wVar1;
  
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_error_mixed.c"
             ,L'\x0f',"test_expand.error");
  extract_reference_file("test_expand.plain");
  extract_reference_file("test_expand.Z");
  wVar1 = systemf("%s %s %s %s >test.out 2>test.err",testprog,"test_expand.plain",
                  "test_expand.error");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_error_mixed.c"
                   ,L'\x13',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s %s %s %s >test.out 2>test.err\", testprog, reffile1, reffile2, reffile3)"
                   ,(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_error_mixed.c"
             ,L'\x17',"contents of test_expand.plain.\ncontents of test_expand.Z.\n","test.out");
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_error_mixed.c"
             ,L'\x18',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_error_mixed)
{
	const char *reffile1 = "test_expand.plain";
	const char *reffile2 = "test_expand.error";
	const char *reffile3 = "test_expand.Z";

	assertFileNotExists(reffile2);
	extract_reference_file(reffile1);
	extract_reference_file(reffile3);
	assert(0 != systemf("%s %s %s %s >test.out 2>test.err",
	    testprog, reffile1, reffile2, reffile3));

	assertTextFileContents(
	    "contents of test_expand.plain.\n"
	    "contents of test_expand.Z.\n", "test.out");
	assertNonEmptyFile("test.err");
}